

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int find_newc_header(archive_read *a)

{
  char cVar1;
  int iVar2;
  long local_48;
  ssize_t bytes;
  size_t skipped;
  size_t skip;
  char *q;
  char *p;
  void *h;
  archive_read *a_local;
  
  bytes = 0;
  h = a;
  while( true ) {
    q = (char *)__archive_read_ahead((archive_read *)h,0x6e,&local_48);
    if (q == (char *)0x0) {
      return -0x1e;
    }
    skip = (size_t)(q + local_48);
    p = q;
    iVar2 = memcmp("07070",q,5);
    if ((iVar2 == 0) && (((q[5] == '1' || (q[5] == '2')) && (iVar2 = is_hex(q,0x6e), iVar2 != 0))))
    break;
    while (q + 0x6e <= skip) {
      cVar1 = q[5];
      if (cVar1 == '0') {
        q = q + 1;
      }
      else if (cVar1 == '1' || cVar1 == '2') {
        iVar2 = memcmp("07070",q,5);
        if ((iVar2 == 0) && (iVar2 = is_hex(q,0x6e), iVar2 != 0)) {
          skipped = (long)q - (long)p;
          __archive_read_consume((archive_read *)h,skipped);
          bytes = skipped + bytes;
          if (bytes != 0) {
            archive_set_error((archive *)h,0,"Skipped %d bytes before finding valid header",
                              bytes & 0xffffffff);
            return -0x14;
          }
          return 0;
        }
        q = q + 2;
      }
      else {
        q = q + 6;
      }
    }
    skipped = (long)q - (long)p;
    __archive_read_consume((archive_read *)h,skipped);
    bytes = skipped + bytes;
  }
  return 0;
}

Assistant:

static int
find_newc_header(struct archive_read *a)
{
	const void *h;
	const char *p, *q;
	size_t skip, skipped = 0;
	ssize_t bytes;

	for (;;) {
		h = __archive_read_ahead(a, newc_header_size, &bytes);
		if (h == NULL)
			return (ARCHIVE_FATAL);
		p = h;
		q = p + bytes;

		/* Try the typical case first, then go into the slow search.*/
		if (memcmp("07070", p, 5) == 0
		    && (p[5] == '1' || p[5] == '2')
		    && is_hex(p, newc_header_size))
			return (ARCHIVE_OK);

		/*
		 * Scan ahead until we find something that looks
		 * like a newc header.
		 */
		while (p + newc_header_size <= q) {
			switch (p[5]) {
			case '1':
			case '2':
				if (memcmp("07070", p, 5) == 0
				    && is_hex(p, newc_header_size)) {
					skip = p - (const char *)h;
					__archive_read_consume(a, skip);
					skipped += skip;
					if (skipped > 0) {
						archive_set_error(&a->archive,
						    0,
						    "Skipped %d bytes before "
						    "finding valid header",
						    (int)skipped);
						return (ARCHIVE_WARN);
					}
					return (ARCHIVE_OK);
				}
				p += 2;
				break;
			case '0':
				p++;
				break;
			default:
				p += 6;
				break;
			}
		}
		skip = p - (const char *)h;
		__archive_read_consume(a, skip);
		skipped += skip;
	}
}